

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

bool nullcInitIOModule(void *context,_func_uint_void_ptr_char_ptr_uint *writeFunc,
                      _func_uint_void_ptr_char_ptr_uint *readFunc)

{
  nullres nVar1;
  
  NULLCIO::contextFunc = context;
  NULLCIO::writeFunc = writeFunc;
  NULLCIO::readFunc = readFunc;
  nVar1 = nullcBindModuleFunctionWrapper
                    ("std.io",NULLCIO::WriteToConsole,nullcWrapCall1<void,NULLCArray>,"Print",0);
  if (nVar1 == '\0') {
    return false;
  }
  nVar1 = nullcBindModuleFunctionWrapper
                    ("std.io",NULLCIO::WriteIntConsole,nullcWrapCall2<void,int,int>,"Print",1);
  if ((((nVar1 != '\0') &&
       (nVar1 = nullcBindModuleFunctionWrapper
                          ("std.io",NULLCIO::WriteDoubleConsole,nullcWrapCall2<void,double,int>,
                           "Print",2), nVar1 != '\0')) &&
      (nVar1 = nullcBindModuleFunctionWrapper
                         ("std.io",NULLCIO::WriteLongConsole,nullcWrapCall2<void,long_long,int>,
                          "Print",3), nVar1 != '\0')) &&
     (nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::WriteCharConsole,nullcWrapCall1<void,char>,"Print",4),
     nVar1 != '\0')) {
    nVar1 = nullcBindModuleFunctionWrapper
                      ("std.io",NULLCIO::ReadTextFromConsole,nullcWrapCall1<int,NULLCArray>,"Input",
                       0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionWrapper
                      ("std.io",NULLCIO::ReadIntFromConsole,nullcWrapCall1<void,int*>,"Input",1);
    if (nVar1 != '\0') {
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::WriteToConsoleExact,nullcWrapCall1<void,NULLCArray>,
                         "Write",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::SetConsoleCursorPos,nullcWrapCall2<void,int,int>,
                         "SetConsoleCursorPos",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::GetKeyboardState,nullcWrapCall1<void,NULLCArray>,
                         "GetKeyboardState",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::GetMouseState,nullcWrapCall2<void,int*,int*>,
                         "GetMouseState",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::IsPressed,nullcWrapCall1<bool,int>,"IsPressed",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::IsToggled,nullcWrapCall1<bool,int>,"IsToggled",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.io",NULLCIO::IsPressed,nullcWrapCall1<bool,int>,"IsPressed",1);
      if (nVar1 != '\0') {
        nVar1 = nullcBindModuleFunctionWrapper
                          ("std.io",NULLCIO::IsToggled,nullcWrapCall1<bool,int>,"IsToggled",1);
        return nVar1 != '\0';
      }
    }
  }
  return false;
}

Assistant:

bool nullcInitIOModule(void *context, unsigned (*writeFunc)(void *context, char *data, unsigned length), unsigned (*readFunc)(void *context, char *target, unsigned length))
{
	NULLCIO::contextFunc = context;
	NULLCIO::writeFunc = writeFunc;
	NULLCIO::readFunc = readFunc;

	REGISTER_FUNC(WriteToConsole, "Print", 0);
	REGISTER_FUNC(WriteIntConsole, "Print", 1);
	REGISTER_FUNC(WriteDoubleConsole, "Print", 2);
	REGISTER_FUNC(WriteLongConsole, "Print", 3);
	REGISTER_FUNC(WriteCharConsole, "Print", 4);
	REGISTER_FUNC(ReadTextFromConsole, "Input", 0);
	REGISTER_FUNC(ReadIntFromConsole, "Input", 1);
	REGISTER_FUNC(WriteToConsoleExact, "Write", 0);
	REGISTER_FUNC(SetConsoleCursorPos, "SetConsoleCursorPos", 0);

	REGISTER_FUNC(GetKeyboardState, "GetKeyboardState", 0);
	REGISTER_FUNC(GetMouseState, "GetMouseState", 0);
	REGISTER_FUNC(IsPressed, "IsPressed", 0);
	REGISTER_FUNC(IsToggled, "IsToggled", 0);
	REGISTER_FUNC(IsPressed, "IsPressed", 1);
	REGISTER_FUNC(IsToggled, "IsToggled", 1);

	return true;
}